

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dish.cpp
# Opt level: O0

void __thiscall Dish::Dish(Dish *this,int d_id,string *d_name,int d_price,DishType d_type)

{
  DishType d_type_local;
  int d_price_local;
  string *d_name_local;
  int d_id_local;
  Dish *this_local;
  
  this->id = d_id;
  std::__cxx11::string::string((string *)&this->name,(string *)d_name);
  this->price = d_price;
  this->type = d_type;
  return;
}

Assistant:

Dish::Dish(int d_id, std::string d_name, int d_price, DishType d_type) : id(d_id), name(std::move(d_name)), price(d_price), type(d_type){}